

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

void __thiscall ON_StringBuffer::~ON_StringBuffer(ON_StringBuffer *this)

{
  this->m_buffer = (char *)0x0;
  this->m_buffer_capacity = 0;
  if (this->m_heap_buffer != (char *)0x0) {
    operator_delete__(this->m_heap_buffer);
    this->m_heap_buffer = (char *)0x0;
  }
  this->m_heap_buffer_capacity = 0;
  return;
}

Assistant:

ON_StringBuffer::~ON_StringBuffer()
{
  m_buffer = nullptr;
  m_buffer_capacity = 0;
  if (nullptr != m_heap_buffer)
  {
    delete[] m_heap_buffer;
    m_heap_buffer = nullptr;
  }
  m_heap_buffer_capacity = 0;
}